

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

shared_ptr<const_tchecker::clockbounds::global_m_map_t> __thiscall
tchecker::clockbounds::clockbounds_t::global_m_map(clockbounds_t *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<const_tchecker::clockbounds::global_m_map_t> sVar1;
  
  std::__shared_ptr<tchecker::clockbounds::global_m_map_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::clockbounds::global_m_map_t,void>
            ((__shared_ptr<tchecker::clockbounds::global_m_map_t_const,(__gnu_cxx::_Lock_policy)2> *
             )this,(__shared_ptr<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>
                    *)(in_RSI + 0x10));
  sVar1.super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<const_tchecker::clockbounds::global_m_map_t>)
         sVar1.
         super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<tchecker::clockbounds::global_m_map_t const> clockbounds_t::global_m_map() const { return _global_m; }